

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fc_layer.h
# Opt level: O1

void __thiscall fc_layer_t::calc_grads(fc_layer_t *this,tensor_t<float> *grad_next_layer)

{
  float fVar1;
  pointer __s;
  pointer pfVar2;
  pointer pgVar3;
  float *pfVar4;
  long lVar5;
  int _y;
  int _x;
  int _z;
  undefined1 auVar6 [16];
  float fVar7;
  
  __s = (this->super_layer_t).grads_in.data.super__Vector_base<float,_std::allocator<float>_>.
        _M_impl.super__Vector_impl_data._M_start;
  pfVar2 = (this->super_layer_t).grads_in.data.super__Vector_base<float,_std::allocator<float>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (__s != pfVar2) {
    memset(__s,0,(long)pfVar2 - (long)__s & 0xfffffffffffffffc);
  }
  if (0 < (this->super_layer_t).out.size.x) {
    lVar5 = 0;
    do {
      pgVar3 = (this->gradients).super__Vector_base<gradient_t,_std::allocator<gradient_t>_>._M_impl
               .super__Vector_impl_data._M_start;
      pfVar4 = tensor_t<float>::get(grad_next_layer,(int)lVar5,0,0);
      auVar6._8_4_ = 0x80000000;
      auVar6._0_8_ = 0x8000000080000000;
      auVar6._12_4_ = 0x80000000;
      auVar6 = vxorps_avx512vl(ZEXT416((uint)(this->input).
                                             super__Vector_base<float,_std::allocator<float>_>.
                                             _M_impl.super__Vector_impl_data._M_start[lVar5]),auVar6
                              );
      fVar7 = expf(auVar6._0_4_);
      fVar7 = 1.0 / (fVar7 + 1.0);
      auVar6 = ZEXT416((uint)(fVar7 * *pfVar4));
      auVar6 = vfnmadd213ss_fma(auVar6,ZEXT416((uint)fVar7),auVar6);
      pgVar3[lVar5].grad = auVar6._0_4_;
      if (0 < (this->super_layer_t).in.size.x) {
        _x = 0;
        do {
          if (0 < (this->super_layer_t).in.size.y) {
            _y = 0;
            do {
              if (0 < (this->super_layer_t).in.size.z) {
                _z = 0;
                do {
                  fVar7 = pgVar3[lVar5].grad;
                  pfVar4 = tensor_t<float>::get
                                     (&this->weights,
                                      ((this->super_layer_t).in.size.y * _z + _y) *
                                      (this->super_layer_t).in.size.x + _x,(int)lVar5,0);
                  fVar1 = *pfVar4;
                  pfVar4 = tensor_t<float>::get(&(this->super_layer_t).grads_in,_x,_y,_z);
                  auVar6 = vfmadd213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)fVar7),
                                           ZEXT416((uint)*pfVar4));
                  *pfVar4 = auVar6._0_4_;
                  _z = _z + 1;
                } while (_z < (this->super_layer_t).in.size.z);
              }
              _y = _y + 1;
            } while (_y < (this->super_layer_t).in.size.y);
          }
          _x = _x + 1;
        } while (_x < (this->super_layer_t).in.size.x);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < (this->super_layer_t).out.size.x);
  }
  return;
}

Assistant:

void calc_grads(tensor_t<float> &grad_next_layer) {
    grads_in.clear();
    for (int n = 0; n < out.size.x; n++) {
      gradient_t &grad = gradients[n];
      grad.grad = grad_next_layer(n, 0, 0) * activator_derivative(input[n]);

      for (int i = 0; i < in.size.x; i++)
        for (int j = 0; j < in.size.y; j++)
          for (int z = 0; z < in.size.z; z++) {
            int m = map({i, j, z});
            grads_in(i, j, z) += grad.grad * weights(m, n, 0);
          }
    }
  }